

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O1

btRigidBody * btActionInterface::getFixedBody(void)

{
  int iVar1;
  btVector3 local_18;
  
  if (getFixedBody()::s_fixed == '\0') {
    iVar1 = __cxa_guard_acquire(&getFixedBody()::s_fixed);
    if (iVar1 != 0) {
      local_18.m_floats[0] = 0.0;
      local_18.m_floats[1] = 0.0;
      local_18.m_floats[2] = 0.0;
      local_18.m_floats[3] = 0.0;
      btRigidBody::btRigidBody
                (&getFixedBody::s_fixed,0.0,(btMotionState *)0x0,(btCollisionShape *)0x0,&local_18);
      __cxa_atexit(btRigidBody::~btRigidBody,&getFixedBody::s_fixed,&__dso_handle);
      __cxa_guard_release(&getFixedBody()::s_fixed);
    }
  }
  local_18.m_floats[0] = 0.0;
  local_18.m_floats[1] = 0.0;
  local_18.m_floats[2] = 0.0;
  local_18.m_floats[3] = 0.0;
  btRigidBody::setMassProps(&getFixedBody::s_fixed,0.0,&local_18);
  return &getFixedBody::s_fixed;
}

Assistant:

btRigidBody& btActionInterface::getFixedBody()
{
	static btRigidBody s_fixed(0, 0,0);
	s_fixed.setMassProps(btScalar(0.),btVector3(btScalar(0.),btScalar(0.),btScalar(0.)));
	return s_fixed;
}